

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

bool __thiscall
deqp::gls::BuiltinPrecisionTests::
InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>
::operator()(InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>
             *this,InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                   *in1,
            InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            *in2)

{
  bool bVar1;
  bool bVar2;
  Vector<float,_2> *val1;
  Vector<float,_2> *val2;
  
  bVar1 = inputLess<tcu::Vector<float,2>>((Vector<float,_2> *)in1,(Vector<float,_2> *)in2);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = inputLess<tcu::Vector<float,2>>((Vector<float,_2> *)in2,(Vector<float,_2> *)in1);
    if (!bVar1) {
      val1 = &(in1->
              super_Tuple4<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
              ).b;
      val2 = &(in2->
              super_Tuple4<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>
              ).b;
      bVar1 = inputLess<tcu::Vector<float,2>>(val1,val2);
      if (bVar1) {
        return true;
      }
      inputLess<tcu::Vector<float,2>>(val2,val1);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator() (const InTuple<In>& in1, const InTuple<In>& in2) const
	{
		if (inputLess(in1.a, in2.a))
			return true;
		if (inputLess(in2.a, in1.a))
			return false;
		if (inputLess(in1.b, in2.b))
			return true;
		if (inputLess(in2.b, in1.b))
			return false;
		if (inputLess(in1.c, in2.c))
			return true;
		if (inputLess(in2.c, in1.c))
			return false;
		if (inputLess(in1.d, in2.d))
			return true;
		return false;
	}